

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::ObjectIntersectorK<4,_false>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  undefined4 uVar2;
  uint uVar3;
  ulong uVar4;
  _func_int **pp_Var5;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  NodeRef nodeRef;
  size_t sVar11;
  size_t sVar12;
  NodeRef *pNVar13;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  vint4 ai_2;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar17;
  undefined1 in_ZMM1 [64];
  vint4 ai;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar20;
  vint4 ai_1;
  undefined1 auVar21 [16];
  vint4 ai_3;
  undefined1 auVar22 [16];
  vint4 bi;
  undefined1 auVar23 [16];
  vint4 bi_1;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vint4 bi_3;
  undefined1 auVar26 [16];
  vint4 bi_2;
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  vint4 bi_8;
  RTCIntersectFunctionNArguments local_17b0;
  Geometry *local_1780;
  undefined8 local_1778;
  RTCIntersectArguments *local_1770;
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1718;
  undefined1 local_1708 [16];
  undefined1 local_16f8 [16];
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  sVar11 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (sVar11 != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      intersectCoherent(valid_i,This,ray,context);
      return;
    }
    auVar19 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
    auVar19 = vpcmpeqd_avx((undefined1  [16])valid_i->field_0,auVar19);
    if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar19[0xf] < '\0')
    {
      auVar21 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x40);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar31 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      local_1718.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar21,auVar19);
      auVar32 = ZEXT1664((undefined1  [16])local_1718);
      auVar19 = *(undefined1 (*) [16])(ray + 0x10);
      auVar21 = *(undefined1 (*) [16])(ray + 0x20);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = sVar11;
      stack_near[1].field_0 = local_1718;
      if (sVar11 != 0xfffffffffffffff8) {
        auVar27._8_4_ = 0x7fffffff;
        auVar27._0_8_ = 0x7fffffff7fffffff;
        auVar27._12_4_ = 0x7fffffff;
        auVar18 = vandps_avx(auVar27,*(undefined1 (*) [16])(ray + 0x40));
        auVar29._8_4_ = 0x219392ef;
        auVar29._0_8_ = 0x219392ef219392ef;
        auVar29._12_4_ = 0x219392ef;
        auVar18 = vcmpps_avx(auVar18,auVar29,1);
        auVar15 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar29,auVar18);
        auVar18 = vandps_avx(auVar27,*(undefined1 (*) [16])(ray + 0x50));
        auVar18 = vcmpps_avx(auVar18,auVar29,1);
        auVar22 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar29,auVar18);
        auVar18 = vandps_avx(auVar27,*(undefined1 (*) [16])(ray + 0x60));
        auVar18 = vcmpps_avx(auVar18,auVar29,1);
        auVar18 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar29,auVar18);
        auVar27 = vrcpps_avx(auVar15);
        auVar24._8_4_ = 0x3f800000;
        auVar24._0_8_ = 0x3f8000003f800000;
        auVar24._12_4_ = 0x3f800000;
        auVar29 = vfnmadd213ps_fma(auVar15,auVar27,auVar24);
        auVar15 = vrcpps_avx(auVar22);
        auVar23 = vfnmadd213ps_fma(auVar22,auVar15,auVar24);
        auVar22 = vrcpps_avx(auVar18);
        auVar18 = vfnmadd213ps_fma(auVar18,auVar22,auVar24);
        local_1728 = vfmadd132ps_fma(auVar29,auVar27,auVar27);
        auVar28 = ZEXT1664(local_1728);
        local_1738 = vfmadd132ps_fma(auVar23,auVar15,auVar15);
        auVar33 = ZEXT1664(local_1738);
        local_1748 = vfmadd132ps_fma(auVar18,auVar22,auVar22);
        auVar30 = ZEXT1664(local_1748);
        local_1758._0_4_ = local_1728._0_4_ * -*(float *)ray;
        local_1758._4_4_ = local_1728._4_4_ * -*(float *)(ray + 4);
        local_1758._8_4_ = local_1728._8_4_ * -*(float *)(ray + 8);
        local_1758._12_4_ = local_1728._12_4_ * -*(float *)(ray + 0xc);
        auVar34 = ZEXT1664(local_1758);
        local_1768._0_4_ = local_1738._0_4_ * -auVar19._0_4_;
        local_1768._4_4_ = local_1738._4_4_ * -auVar19._4_4_;
        local_1768._8_4_ = local_1738._8_4_ * -auVar19._8_4_;
        local_1768._12_4_ = local_1738._12_4_ * -auVar19._12_4_;
        auVar35 = ZEXT1664(local_1768);
        local_16f8._0_4_ = local_1748._0_4_ * -auVar21._0_4_;
        local_16f8._4_4_ = local_1748._4_4_ * -auVar21._4_4_;
        local_16f8._8_4_ = local_1748._8_4_ * -auVar21._8_4_;
        local_16f8._12_4_ = local_1748._12_4_ * -auVar21._12_4_;
        auVar19 = vpcmpeqd_avx(local_16f8,local_16f8);
        auVar21 = vpcmpeqd_avx((undefined1  [16])valid_i->field_0,auVar19);
        pNVar13 = stack_node + 1;
        auVar19 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa10);
        auVar18._8_4_ = 0xff800000;
        auVar18._0_8_ = 0xff800000ff800000;
        auVar18._12_4_ = 0xff800000;
        bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                       vblendvps_avx(auVar18,auVar19,auVar21);
        paVar6 = &stack_near[2].field_0;
        do {
          paVar1 = paVar6 + -1;
          auVar16 = ZEXT1664((undefined1  [16])*paVar1);
          paVar6 = paVar6 + -1;
          auVar19 = vcmpps_avx((undefined1  [16])*paVar1,(undefined1  [16])bi_8.field_0,1);
          if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar19[0xf] < '\0') {
            while ((sVar11 & 8) == 0) {
              lVar7 = 0;
              uVar4 = 0;
              auVar16 = ZEXT1664(auVar31._0_16_);
              sVar12 = 8;
              do {
                sVar9 = *(size_t *)((sVar11 & 0xfffffffffffffff0) + lVar7 * 8);
                if (sVar9 == 8) break;
                uVar2 = *(undefined4 *)(sVar11 + 0x20 + lVar7 * 4);
                auVar19._4_4_ = uVar2;
                auVar19._0_4_ = uVar2;
                auVar19._8_4_ = uVar2;
                auVar19._12_4_ = uVar2;
                auVar18 = vfmadd213ps_fma(auVar19,auVar28._0_16_,auVar34._0_16_);
                uVar2 = *(undefined4 *)(sVar11 + 0x40 + lVar7 * 4);
                auVar21._4_4_ = uVar2;
                auVar21._0_4_ = uVar2;
                auVar21._8_4_ = uVar2;
                auVar21._12_4_ = uVar2;
                auVar15 = vfmadd213ps_fma(auVar21,auVar33._0_16_,auVar35._0_16_);
                uVar2 = *(undefined4 *)(sVar11 + 0x60 + lVar7 * 4);
                auVar22._4_4_ = uVar2;
                auVar22._0_4_ = uVar2;
                auVar22._8_4_ = uVar2;
                auVar22._12_4_ = uVar2;
                auVar22 = vfmadd213ps_fma(auVar22,auVar30._0_16_,local_16f8);
                uVar2 = *(undefined4 *)(sVar11 + 0x30 + lVar7 * 4);
                auVar23._4_4_ = uVar2;
                auVar23._0_4_ = uVar2;
                auVar23._8_4_ = uVar2;
                auVar23._12_4_ = uVar2;
                auVar27 = vfmadd213ps_fma(auVar23,auVar28._0_16_,auVar34._0_16_);
                uVar2 = *(undefined4 *)(sVar11 + 0x50 + lVar7 * 4);
                auVar25._4_4_ = uVar2;
                auVar25._0_4_ = uVar2;
                auVar25._8_4_ = uVar2;
                auVar25._12_4_ = uVar2;
                auVar29 = vfmadd213ps_fma(auVar25,auVar33._0_16_,auVar35._0_16_);
                uVar2 = *(undefined4 *)(sVar11 + 0x70 + lVar7 * 4);
                auVar26._4_4_ = uVar2;
                auVar26._0_4_ = uVar2;
                auVar26._8_4_ = uVar2;
                auVar26._12_4_ = uVar2;
                auVar23 = vfmadd213ps_fma(auVar26,auVar30._0_16_,local_16f8);
                auVar19 = vpminsd_avx(auVar18,auVar27);
                auVar21 = vpminsd_avx(auVar15,auVar29);
                auVar19 = vpmaxsd_avx(auVar19,auVar21);
                auVar21 = vpminsd_avx(auVar22,auVar23);
                auVar21 = vpmaxsd_avx(auVar19,auVar21);
                auVar19 = vpmaxsd_avx(auVar18,auVar27);
                auVar18 = vpmaxsd_avx(auVar15,auVar29);
                auVar15 = vpminsd_avx(auVar19,auVar18);
                auVar19 = vpmaxsd_avx(auVar22,auVar23);
                auVar18 = vpmaxsd_avx(auVar21,auVar32._0_16_);
                auVar19 = vpminsd_avx(auVar19,(undefined1  [16])bi_8.field_0);
                auVar19 = vpminsd_avx(auVar15,auVar19);
                auVar19 = vcmpps_avx(auVar18,auVar19,2);
                if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar19[0xf] < '\0') {
                  aVar20 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vblendvps_avx(auVar31._0_16_,auVar21,auVar19);
                  aVar14 = auVar16._0_16_;
                  auVar19 = vcmpps_avx((undefined1  [16])aVar20,(undefined1  [16])aVar14,1);
                  sVar8 = sVar12;
                  sVar10 = sVar9;
                  aVar17 = aVar20;
                  if (((((auVar19 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                        (auVar19 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar19 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       -1 < auVar19[0xf]) ||
                     (sVar8 = sVar9, sVar10 = sVar12, aVar17 = aVar14, aVar14 = aVar20, sVar12 != 8)
                     ) {
                    aVar20 = aVar14;
                    uVar4 = uVar4 + 1;
                    pNVar13->ptr = sVar10;
                    pNVar13 = pNVar13 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar6->v = aVar17;
                    paVar6 = paVar6 + 1;
                    sVar9 = sVar8;
                  }
                  auVar16 = ZEXT1664((undefined1  [16])aVar20);
                  sVar12 = sVar9;
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 != 4);
              if (sVar12 == 8) goto LAB_004e925c;
              sVar11 = sVar12;
              if (1 < uVar4) {
                aVar20 = paVar6[-2];
                aVar17 = paVar6[-1];
                auVar19 = vcmpps_avx((undefined1  [16])aVar20,(undefined1  [16])aVar17,1);
                aVar14 = aVar17;
                if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar19[0xf] < '\0') {
                  paVar6[-2] = aVar17;
                  paVar6[-1] = aVar20;
                  auVar19 = vpermilps_avx(*(undefined1 (*) [16])(pNVar13 + -2),0x4e);
                  *(undefined1 (*) [16])(pNVar13 + -2) = auVar19;
                  aVar14 = aVar20;
                  aVar20 = aVar17;
                }
                if (uVar4 != 2) {
                  aVar17 = paVar6[-3];
                  auVar19 = vcmpps_avx((undefined1  [16])aVar17,(undefined1  [16])aVar14,1);
                  if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar19[0xf] < '\0') {
                    paVar6[-3] = aVar14;
                    paVar6[-1] = aVar17;
                    sVar12 = pNVar13[-3].ptr;
                    pNVar13[-3].ptr = pNVar13[-1].ptr;
                    pNVar13[-1].ptr = sVar12;
                    aVar17 = aVar14;
                  }
                  auVar19 = vcmpps_avx((undefined1  [16])aVar17,(undefined1  [16])aVar20,1);
                  if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar19[0xf] < '\0') {
                    paVar6[-3] = aVar20;
                    paVar6[-2] = aVar17;
                    auVar19 = vpermilps_avx(*(undefined1 (*) [16])(pNVar13 + -3),0x4e);
                    *(undefined1 (*) [16])(pNVar13 + -3) = auVar19;
                  }
                }
              }
            }
            if (sVar11 == 0xfffffffffffffff8) {
              return;
            }
            auVar19 = vcmpps_avx((undefined1  [16])bi_8.field_0,auVar16._0_16_,6);
            auVar16 = ZEXT1664(auVar19);
            if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar19[0xf] < '\0') {
              uVar4 = (ulong)((uint)sVar11 & 0xf);
              if (uVar4 != 8) {
                lVar7 = 0;
                local_1708 = auVar19;
                do {
                  local_17b0.geomID = *(uint *)((sVar11 & 0xfffffffffffffff0) + lVar7 * 8);
                  local_1780 = (context->scene->geometries).items[local_17b0.geomID].ptr;
                  uVar3 = local_1780->mask;
                  auVar15._4_4_ = uVar3;
                  auVar15._0_4_ = uVar3;
                  auVar15._8_4_ = uVar3;
                  auVar15._12_4_ = uVar3;
                  auVar19 = vpand_avx(auVar15,*(undefined1 (*) [16])(ray + 0x90));
                  auVar19 = vpcmpeqd_avx(auVar19,_DAT_01f7aa10);
                  auVar21 = auVar16._0_16_ & ~auVar19;
                  if ((((auVar21 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar21 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar21 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar21[0xf] < '\0') {
                    mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                   vandnps_avx(auVar19,auVar16._0_16_);
                    local_17b0.primID = *(uint *)((sVar11 & 0xfffffffffffffff0) + 4 + lVar7 * 8);
                    local_17b0.valid = (int *)&mask;
                    local_17b0.geometryUserPtr = local_1780->userPtr;
                    local_17b0.context = context->user;
                    local_17b0.N = 4;
                    local_1778 = 0;
                    local_1770 = context->args;
                    pp_Var5 = (_func_int **)local_1770->intersect;
                    if (pp_Var5 == (_func_int **)0x0) {
                      pp_Var5 = local_1780[1].super_RefCount._vptr_RefCount;
                    }
                    local_17b0.rayhit = (RTCRayHitN *)ray;
                    (*(code *)pp_Var5)(&local_17b0);
                    auVar31 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000))
                                      );
                    auVar32 = ZEXT1664((undefined1  [16])local_1718);
                    auVar28 = ZEXT1664(local_1728);
                    auVar33 = ZEXT1664(local_1738);
                    auVar30 = ZEXT1664(local_1748);
                    auVar34 = ZEXT1664(local_1758);
                    auVar35 = ZEXT1664(local_1768);
                    auVar16 = ZEXT1664(local_1708);
                  }
                  auVar19 = auVar16._0_16_;
                  lVar7 = lVar7 + 1;
                } while (uVar4 - 8 != lVar7);
              }
              bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                             vblendvps_avx((undefined1  [16])bi_8.field_0,
                                           *(undefined1 (*) [16])(ray + 0x80),auVar19);
            }
          }
LAB_004e925c:
          sVar11 = pNVar13[-1].ptr;
          pNVar13 = pNVar13 + -1;
        } while (sVar11 != 0xfffffffffffffff8);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }